

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O1

void google::protobuf::internal::LogIndexOutOfBoundsAndAbort(int index,int size)

{
  LogMessage *this;
  string_view str;
  string_view str_00;
  LogMessage local_30;
  int local_1c;
  
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.cc"
             ,0x25);
  str._M_str = "index: ";
  str._M_len = 7;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_30,str);
  local_1c = index;
  this = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(&local_30,&local_1c);
  str_00._M_str = ", size: ";
  str_00._M_len = 8;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this,str_00);
  absl::lts_20250127::log_internal::LogMessage::operator<<(this,size);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

[[noreturn]] void LogIndexOutOfBoundsAndAbort(int index, int size) {
  ABSL_LOG(FATAL) << "index: " << index << ", size: " << size;
}